

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall llvm::raw_ostream::write_zeros(raw_ostream *this,uint NumZeros)

{
  size_t in_RCX;
  void *__buf;
  
  if (NumZeros < 0x50) {
    write(this,0xe66e30,(void *)(ulong)NumZeros,in_RCX);
  }
  else {
    do {
      __buf = (void *)0x4f;
      if (NumZeros < 0x4f) {
        __buf = (void *)(ulong)NumZeros;
      }
      write(this,0xe66e30,__buf,in_RCX);
      NumZeros = NumZeros - (int)__buf;
    } while (NumZeros != 0);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::write_zeros(unsigned NumZeros) {
  return write_padding<'\0'>(*this, NumZeros);
}